

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

bool __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::edgeExists
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t a,size_t b)

{
  bool bVar1;
  size_type in_RSI;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_RDI;
  bool local_29;
  _Self local_28;
  _Self local_20 [2];
  size_type local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,in_RSI);
  bVar1 = std::
          map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          ::empty((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                   *)0x1b9002);
  local_29 = false;
  if (!bVar1) {
    std::
    vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                  *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,local_10);
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         ::find(in_RDI,(key_type *)0x1b902e);
    std::
    vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                  *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,local_10);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
         ::end(in_RDI);
    local_29 = std::operator!=(local_20,&local_28);
  }
  return local_29;
}

Assistant:

inline bool edgeExists(size_t a, size_t b) const
    {
        return !vertices_[a].empty() &&
               vertices_[a].find(b) != vertices_[a].end();
    }